

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::unregister(CommonCore *this)

{
  string_view name;
  string_view name_00;
  char *unaff_RBX;
  shared_ptr<helics::Core> keepCoreAlive2;
  shared_ptr<helics::Core> keepCoreAlive;
  CommonCore *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  CommonCore *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe8;
  
  name._M_str = unaff_RBX;
  name._M_len = (size_t)in_stack_ffffffffffffffe8._M_pi;
  CoreFactory::findCore(name);
  if (local_20 == this) {
    CoreFactory::unregisterCore
              ((string_view)
               keepCoreAlive2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((this->prevIdentifier)._M_string_length != 0) {
    name_00._M_str = unaff_RBX;
    name_00._M_len = (size_t)in_stack_ffffffffffffffe8._M_pi;
    CoreFactory::findCore(name_00);
    if (local_30 == this) {
      CoreFactory::unregisterCore
                ((string_view)
                 keepCoreAlive2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void CommonCore::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepCoreAlive = CoreFactory::findCore(identifier);
    if (keepCoreAlive) {
        if (keepCoreAlive.get() == this) {
            CoreFactory::unregisterCore(identifier);
        }
    }

    if (!prevIdentifier.empty()) {
        auto keepCoreAlive2 = CoreFactory::findCore(prevIdentifier);
        if (keepCoreAlive2) {
            if (keepCoreAlive2.get() == this) {
                CoreFactory::unregisterCore(prevIdentifier);
            }
        }
    }
}